

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

void __thiscall Shell::parse(Shell *this,Element *s)

{
  bool bVar1;
  undefined1 auVar2 [16];
  Literals local_60;
  undefined1 local_28 [8];
  IString id;
  Element *s_local;
  Shell *this_local;
  
  id.str._M_str = (char *)s;
  ::wasm::Element::operator[]((uint)s);
  auVar2 = ::wasm::Element::str();
  id.str._M_len = auVar2._8_8_;
  local_28 = auVar2._0_8_;
  bVar1 = ::wasm::IString::operator==((IString *)local_28,(IString *)&::wasm::MODULE);
  if (bVar1) {
    parseModule(this,(Element *)id.str._M_str);
  }
  else {
    bVar1 = ::wasm::IString::operator==((IString *)local_28,&REGISTER.super_IString);
    if (bVar1) {
      parseRegister(this,(Element *)id.str._M_str);
    }
    else {
      bVar1 = ::wasm::IString::operator==((IString *)local_28,&INVOKE.super_IString);
      if (bVar1) {
        parseOperation(&local_60,this,(Element *)id.str._M_str);
        ::wasm::Literals::~Literals(&local_60);
      }
      else {
        bVar1 = ::wasm::IString::operator==((IString *)local_28,&ASSERT_RETURN.super_IString);
        if (bVar1) {
          parseAssertReturn(this,(Element *)id.str._M_str);
        }
        else {
          bVar1 = ::wasm::IString::operator==((IString *)local_28,&ASSERT_TRAP.super_IString);
          if (bVar1) {
            parseAssertTrap(this,(Element *)id.str._M_str);
          }
          else {
            bVar1 = ::wasm::IString::operator==((IString *)local_28,&ASSERT_INVALID.super_IString);
            if ((bVar1) ||
               (bVar1 = ::wasm::IString::operator==
                                  ((IString *)local_28,&ASSERT_MALFORMED.super_IString), bVar1)) {
              parseModuleAssertion(this,(Element *)id.str._M_str);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void parse(Element& s) {
    IString id = s[0]->str();
    if (id == MODULE) {
      parseModule(s);
    } else if (id == REGISTER) {
      parseRegister(s);
    } else if (id == INVOKE) {
      parseOperation(s);
    } else if (id == ASSERT_RETURN) {
      parseAssertReturn(s);
    } else if (id == ASSERT_TRAP) {
      parseAssertTrap(s);
    } else if ((id == ASSERT_INVALID) || (id == ASSERT_MALFORMED)) {
      parseModuleAssertion(s);
    }
  }